

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

bool __thiscall
despot::Adventurer::Step
          (Adventurer *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  *reward = 0.0;
  iVar1 = *(int *)(s + 0xc);
  iVar2 = this->size_;
  iVar4 = iVar1 / iVar2;
  if ((action == 0) && (iVar1 % iVar2 == iVar2 + -1)) {
    *reward = (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
  }
  else {
    lVar6 = *(long *)&(this->transition_probabilities_).
                      super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar1].
                      super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar3 = *(long *)(lVar6 + (long)action * 0x18);
    lVar6 = *(long *)(lVar6 + 8 + (long)action * 0x18) - lVar3;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 5;
      lVar6 = lVar6 + (ulong)(lVar6 == 0);
      pdVar5 = (double *)(lVar3 + 0x18);
      dVar7 = 0.0;
      do {
        dVar8 = *pdVar5;
        dVar7 = dVar7 + dVar8;
        if (random_num <= dVar7) {
          *(undefined4 *)(s + 0xc) = *(undefined4 *)((long)pdVar5 + -0xc);
          dVar8 = (dVar7 - random_num) / dVar8;
          if (dVar8 < this->obs_noise_) {
            iVar4 = (iVar4 + (int)(dVar8 / (this->obs_noise_ / (double)(this->num_goals_ + -1))) + 1
                    ) % this->num_goals_;
          }
          *obs = (long)iVar4;
          return false;
        }
        pdVar5 = pdVar5 + 4;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    *reward = -10.0;
  }
  return true;
}

Assistant:

bool Adventurer::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	AdventurerState& state = static_cast<AdventurerState&>(s);

	reward = 0.0;
	int position = state.state_id % size_;
	int goal_type = state.state_id / size_;

	if (position == size_ - 1 && action == A_STAY) {
		reward = goal_reward_[goal_type];
		return true;
	}

	bool terminal = true;
	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			terminal = false;
			state.state_id = next.state_id;

			random_num = (sum - random_num) / next.weight;
			break;
		}
	}

	if (terminal) {
		reward = -10;
		return true;
	}

	if (random_num >= obs_noise_) {
		obs = goal_type;
	} else {
		int index = int(random_num / (obs_noise_ / (num_goals_ - 1)));
		obs = (1 + index + goal_type) % num_goals_;
	}

	return false;
}